

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O2

bool dxil_spv::emit_create_handle_instruction(Impl *impl,CallInst *instruction)

{
  bool bVar1;
  iterator __it;
  Value *instruction_offset;
  uint32_t resource_range;
  uint32_t resource_type_operand;
  CallInst *instruction_local;
  uint32_t non_uniform;
  
  instruction_local = instruction;
  bVar1 = resource_handle_needs_sink(impl,instruction);
  if (bVar1) {
    __it = std::
           _Hashtable<const_LLVMBC::CallInst_*,_const_LLVMBC::CallInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::CallInst_*>,_std::hash<const_LLVMBC::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           ::find(&(impl->resource_handles_needing_sink)._M_h,&instruction_local);
    std::
    _Hashtable<const_LLVMBC::CallInst_*,_const_LLVMBC::CallInst_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::CallInst_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::CallInst_*>,_std::hash<const_LLVMBC::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::erase(&(impl->resource_handles_needing_sink)._M_h,
            (const_iterator)__it.super__Node_iterator_base<const_LLVMBC::CallInst_*,_false>._M_cur);
    bVar1 = true;
  }
  else {
    bVar1 = get_constant_operand(&instruction->super_Instruction,1,&resource_type_operand);
    if ((bVar1) &&
       (bVar1 = get_constant_operand(&instruction->super_Instruction,2,&resource_range), bVar1)) {
      non_uniform = 0;
      get_constant_operand(&instruction->super_Instruction,4,&non_uniform);
      instruction_offset = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
      bVar1 = emit_create_handle(impl,instruction,(ResourceType)resource_type_operand,resource_range
                                 ,instruction_offset,non_uniform != 0);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool emit_create_handle_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (resource_handle_needs_sink(impl, instruction))
	{
		impl.resource_handles_needing_sink.erase(impl.resource_handles_needing_sink.find(instruction));
		return true;
	}

	uint32_t resource_type_operand, resource_range;

	if (!get_constant_operand(instruction, 1, &resource_type_operand))
		return false;
	if (!get_constant_operand(instruction, 2, &resource_range))
		return false;

	uint32_t non_uniform = 0;
	get_constant_operand(instruction, 4, &non_uniform);

	auto resource_type = static_cast<DXIL::ResourceType>(resource_type_operand);
	return emit_create_handle(impl, instruction, resource_type, resource_range,
	                          instruction->getOperand(3), non_uniform != 0);
}